

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

string * replace(string *__return_storage_ptr__,string *s,string *from,string *to)

{
  ulong uVar1;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  while( true ) {
    uVar1 = std::__cxx11::string::find((string *)__return_storage_ptr__,(ulong)from);
    if (uVar1 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,uVar1,(string *)from->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string replace(const std::string & s, const std::string & from, const std::string & to) {
    std::string result = s;
    size_t pos = 0;
    while ((pos = result.find(from, pos)) != std::string::npos) {
        result.replace(pos, from.length(), to);
        pos += to.length();
    }
    return result;
}